

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  ulong uVar2;
  string local_c0 [8];
  string namespacedTarget;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Self local_50;
  _Self local_48;
  cmTarget *local_40;
  cmTarget *tgt;
  cmMakefile *mf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  cmTarget *target_local;
  string *input_local;
  cmExportFileGenerator *this_local;
  
  mf = (cmMakefile *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)target;
  target_local = (cmTarget *)input;
  input_local = (string *)this;
  tgt = (cmTarget *)cmTarget::GetMakefile(target);
  local_40 = cmMakefile::FindTargetToUse((cmMakefile *)tgt,(string *)target_local,false);
  if (local_40 == (cmTarget *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmTarget::IsImported(local_40);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      local_48._M_node =
           (_Base_ptr)
           std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::find
                     (&this->ExportedTargets,&local_40);
      local_50._M_node =
           (_Base_ptr)
           std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::end
                     (&this->ExportedTargets);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (bVar1) {
        cmTarget::GetExportName_abi_cxx11_(&local_90,local_40);
        std::operator+(&local_70,&this->Namespace,&local_90);
        std::__cxx11::string::operator=((string *)target_local,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::string(local_c0);
        (*this->_vptr_cmExportFileGenerator[4])(this,local_c0,mf,tgt,missingTargets_local,local_40);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator=((string *)target_local,local_c0);
        }
        std::__cxx11::string::~string(local_c0);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
cmExportFileGenerator::AddTargetNamespace(std::string &input,
                                    cmTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  cmMakefile *mf = target->GetMakefile();

  cmTarget *tgt = mf->FindTargetToUse(input);
  if (!tgt)
    {
    return false;
    }

  if(tgt->IsImported())
    {
    return true;
    }
  if(this->ExportedTargets.find(tgt) != this->ExportedTargets.end())
    {
    input = this->Namespace + tgt->GetExportName();
    }
  else
    {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets,
                              mf, target, tgt);
    if (!namespacedTarget.empty())
      {
      input = namespacedTarget;
      }
    }
  return true;
}